

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  char *__nptr;
  bool bVar3;
  int iVar4;
  Repeat RVar5;
  cmValue cVar6;
  ostream *poVar7;
  string *psVar8;
  int *piVar9;
  long lVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  ostringstream cmCTestLog_msg;
  unsigned_long n;
  RegularExpression repeatRegex;
  char *local_2a0;
  undefined8 local_298;
  char local_290;
  undefined7 uStack_28f;
  undefined1 local_280 [112];
  ios_base local_210 [264];
  unsigned_long local_108;
  RegularExpression local_100;
  
  pcVar1 = local_280 + 0x10;
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"TestsToRunInformation","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280);
  SetTestsToRunInformation(this,cVar6);
  if ((pointer)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"UseUnion","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280);
  if (cVar6.Value == (string *)0x0) {
    bVar3 = false;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value);
  }
  this->UseUnion = bVar3;
  if ((pointer)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ScheduleRandom","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280);
  if (cVar6.Value == (string *)0x0) {
    bVar3 = false;
  }
  else {
    value_00._M_str = extraout_RDX_00;
    value_00._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value_00);
  }
  if ((pointer)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  if (bVar3 != false) {
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Random","");
    cmCTest::SetScheduleType(pcVar2,(string *)local_280);
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Repeat","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280);
  if ((pointer)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    local_100.regmust = (char *)0x0;
    local_100.program = (char *)0x0;
    local_100.progsize = 0;
    memset(&local_100,0,0xaa);
    cmsys::RegularExpression::compile(&local_100,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$")
    ;
    bVar3 = cmsys::RegularExpression::find
                      (&local_100,((cVar6.Value)->_M_dataplus)._M_p,&local_100.regmatch);
    if (bVar3) {
      if (local_100.regmatch.startp[2] == (char *)0x0) {
        local_280._8_8_ = 0;
        local_280[0x10] = '\0';
        local_280._0_8_ = pcVar1;
      }
      else {
        local_280._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_280,local_100.regmatch.startp[2],local_100.regmatch.endp[2]);
      }
      local_108 = 1;
      cmStrToULong((string *)local_280,&local_108);
      this->RepeatCount = (int)local_108;
      if (1 < (int)local_108) {
        if (local_100.regmatch.startp[1] == (char *)0x0) {
          local_2a0 = &local_290;
          local_298 = 0;
          local_290 = '\0';
        }
        else {
          local_2a0 = &local_290;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_2a0);
        if (iVar4 == 0) {
          RVar5 = UntilFail;
LAB_0016542d:
          this->RepeatMode = RVar5;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_2a0);
          if (iVar4 == 0) {
            RVar5 = UntilPass;
            goto LAB_0016542d;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_2a0);
          if (iVar4 == 0) {
            RVar5 = AfterTimeout;
            goto LAB_0016542d;
          }
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
        }
      }
      if ((pointer)local_280._0_8_ != pcVar1) {
        operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,"Repeat option invalid value: ",0x1d);
      poVar7 = operator<<((ostream *)local_280,cVar6);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x21c,local_2a0,false);
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
      std::ios_base::~ios_base(local_210);
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if (!bVar3) {
      return false;
    }
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ParallelLevel","");
  cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280);
  if ((pointer)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  if (cVar6.Value == (string *)0x0) {
LAB_00165587:
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"StopOnFailure","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"LabelRegularExpression","")
    ;
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_100,&this->super_cmCTestGenericHandler,(string *)local_280);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_100,&this->IncludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_100);
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"ExcludeLabelRegularExpression","");
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_100,&this->super_cmCTestGenericHandler,(string *)local_280);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_100,&this->ExcludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_100);
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"IncludeRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      this->UseIncludeRegExpFlag = true;
      std::__cxx11::string::_M_assign((string *)&this->IncludeRegExp);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"ExcludeRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      this->UseExcludeRegExpFlag = true;
      this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
      std::__cxx11::string::_M_assign((string *)&this->ExcludeRegExp);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"ExcludeFixtureRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureRegExp);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"ExcludeFixtureSetupRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureSetupRegExp);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"ExcludeFixtureCleanupRegularExpression","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureCleanupRegExp);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ResourceSpecFile","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
    }
    local_280._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"RerunFailed","");
    cVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280)
    ;
    if (cVar6.Value == (string *)0x0) {
      bVar3 = false;
    }
    else {
      value_01._M_str = extraout_RDX_01;
      value_01._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
      bVar3 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value_01);
    }
    this->RerunFailed = bVar3;
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    return true;
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ParallelLevel","");
  psVar8 = (string *)
           cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_280);
  if (psVar8 == (string *)0x0) {
    psVar8 = &cmValue::Empty_abi_cxx11_;
  }
  __nptr = (psVar8->_M_dataplus)._M_p;
  piVar9 = __errno_location();
  iVar4 = *piVar9;
  *piVar9 = 0;
  lVar10 = strtol(__nptr,(char **)&local_100,10);
  if (local_100.regmatch.startp[0] == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar10 == lVar10) && (*piVar9 != 0x22)) {
    if (*piVar9 == 0) {
      *piVar9 = iVar4;
    }
    cmCTest::SetParallelLevel(pcVar2,(int)lVar10);
    if ((pointer)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    goto LAB_00165587;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(cmIsOn(this->GetOption("UseUnion")));
  if (cmIsOn(this->GetOption("ScheduleRandom"))) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << repeat << std::endl);
      return false;
    }
  }
  if (this->GetOption("ParallelLevel")) {
    this->CTest->SetParallelLevel(std::stoi(this->GetOption("ParallelLevel")));
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  this->SetRerunFailed(cmIsOn(this->GetOption("RerunFailed")));

  return true;
}